

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_test.cc
# Opt level: O1

void __thiscall
HMACTest_TestVectors_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,FileTest *t)

{
  bool bVar1;
  int iVar2;
  EVP_MD *pEVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  md;
  uchar *puVar4;
  pointer *__ptr_4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar5;
  char *pcVar6;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  expected_predicate_value;
  ulong uVar7;
  pointer *__ptr;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_;
  uint mac_len;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  ScopedHMAC_CTX ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string digest_str;
  undefined1 local_158 [8];
  EVP_MD *local_150;
  Bytes local_148;
  AssertHelper local_138;
  undefined1 local_130 [8];
  EVP_MD *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  uint local_10c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  undefined1 local_d0 [8];
  EVP_MD *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_d0 = (undefined1  [8])local_c0;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"HMAC","");
  bVar1 = FileTest::GetAttribute((FileTest *)this,&local_48,(string *)local_d0);
  local_130[0] = (internal)bVar1;
  local_128 = (EVP_MD *)0x0;
  if (local_d0 != (undefined1  [8])local_c0) {
    operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
  }
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_130,
               (AssertionResult *)"t->GetAttribute(&digest_str, \"HMAC\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
               ,0x31,(char *)local_d0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if (local_d0 != (undefined1  [8])local_c0) {
      operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  else {
    if (local_128 != (EVP_MD *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar2 == 0) {
      pEVar3 = EVP_md5();
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar2 == 0) {
        pEVar3 = EVP_sha1();
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar2 == 0) {
          pEVar3 = EVP_sha224();
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_48);
          if (iVar2 == 0) {
            pEVar3 = EVP_sha256();
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_48);
            if (iVar2 == 0) {
              pEVar3 = EVP_sha384();
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_48);
              if (iVar2 == 0) {
                pEVar3 = EVP_sha512();
              }
              else {
                pEVar3 = (EVP_MD *)0x0;
              }
            }
          }
        }
      }
    }
    local_130[0] = (internal)(pEVar3 != (EVP_MD *)0x0);
    local_128 = (EVP_MD *)0x0;
    if (pEVar3 != (EVP_MD *)0x0) {
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (uchar *)0x0;
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (uchar *)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0 = (undefined1  [8])local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Key","");
      bVar1 = FileTest::GetBytes((FileTest *)this,&local_e8,(string *)local_d0);
      local_130[0] = (internal)bVar1;
      local_128 = (EVP_MD *)0x0;
      if (local_d0 != (undefined1  [8])local_c0) {
        operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
      }
      if (local_130[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,(internal *)local_130,
                   (AssertionResult *)"t->GetBytes(&key, \"Key\")","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_148,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                   ,0x36,(char *)local_d0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_158);
LAB_00310436:
        pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
        if (local_d0 != (undefined1  [8])local_c0) {
          operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_158 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(size_type *)local_158 + 8))();
        }
        local_c8 = local_128;
        if (local_128 != (EVP_MD *)0x0) {
LAB_0031047a:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8);
        }
      }
      else {
        if (local_128 != (EVP_MD *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        }
        local_d0 = (undefined1  [8])local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Input","");
        bVar1 = FileTest::GetBytes((FileTest *)this,&local_108,(string *)local_d0);
        local_130[0] = (internal)bVar1;
        local_128 = (EVP_MD *)0x0;
        if (local_d0 != (undefined1  [8])local_c0) {
          operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
        }
        if (local_130[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_158);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_d0,(internal *)local_130,
                     (AssertionResult *)"t->GetBytes(&input, \"Input\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                     ,0x37,(char *)local_d0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_148,(Message *)local_158);
          goto LAB_00310436;
        }
        if (local_128 != (EVP_MD *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        }
        local_d0 = (undefined1  [8])local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Output","");
        bVar1 = FileTest::GetBytes((FileTest *)this,&local_68,(string *)local_d0);
        local_130[0] = (internal)bVar1;
        local_128 = (EVP_MD *)0x0;
        if (local_d0 != (undefined1  [8])local_c0) {
          operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
        }
        pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128;
        if (local_130[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_158);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_d0,(internal *)local_130,
                     (AssertionResult *)"t->GetBytes(&output, \"Output\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                     ,0x38,(char *)local_d0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_148,(Message *)local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
          if (local_d0 != (undefined1  [8])local_c0) {
            operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
          }
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_158 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(size_type *)local_158 + 8))();
          }
          local_c8 = local_128;
          if (local_128 == (EVP_MD *)0x0) goto LAB_0031047f;
          goto LAB_0031047a;
        }
        if (local_128 != (EVP_MD *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_128);
        }
        local_130._0_4_ = EVP_MD_size(pEVar3);
        local_130._4_4_ = extraout_var;
        local_158 = (undefined1  [8])
                    ((long)local_68.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_d0,"EVP_MD_size(digest)","output.size()",
                   (unsigned_long *)local_130,(unsigned_long *)local_158);
        if (local_d0[0] == (string)0x0) {
          testing::Message::Message((Message *)local_130);
          if (local_c8 == (EVP_MD *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)local_c8;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_158,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                     ,0x39,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_130)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
          if (local_130 != (undefined1  [8])0x0) {
            (**(code **)(*(size_type *)local_130 + 8))();
          }
          if (local_c8 != (EVP_MD *)0x0) {
            pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_c8;
            goto LAB_0031047a;
          }
        }
        else {
          if (local_c8 != (EVP_MD *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
          }
          iVar2 = EVP_MD_size(pEVar3);
          md._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )operator_new__(CONCAT44(extraout_var_00,iVar2));
          memset((void *)md._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,0,CONCAT44(extraout_var_00,iVar2));
          expected_predicate_value._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               md._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
          puVar4 = HMAC(pEVar3,local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                        (int)local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                        (int)local_e8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                        local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        (uchar *)md._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,&local_10c);
          local_130[0] = (internal)(puVar4 != (uchar *)0x0);
          local_128 = (EVP_MD *)0x0;
          if (puVar4 == (uchar *)0x0) {
            testing::Message::Message((Message *)local_158);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)local_130,
                       (AssertionResult *)
                       "HMAC(digest, key.data(), key.size(), input.data(), input.size(), mac.get(), &mac_len)"
                       ,"false","true",(char *)expected_predicate_value._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                       ,0x3f,(char *)local_d0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_148,(Message *)local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
            if (local_d0 != (undefined1  [8])local_c0) {
              operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
            }
            if (local_158 != (undefined1  [8])0x0) {
              (**(code **)(*(size_type *)local_158 + 8))();
            }
            if (local_128 != (EVP_MD *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_128,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
            }
          }
          else {
            local_128 = (EVP_MD *)
                        (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish +
                        -(long)local_68.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            local_130 = (undefined1  [8])
                        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            local_150 = (EVP_MD *)(ulong)local_10c;
            local_158 = (undefined1  [8])
                        md._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)local_d0,"Bytes(output)","Bytes(mac.get(), mac_len)",
                       (Bytes *)local_130,(Bytes *)local_158);
            if (local_d0[0] == (string)0x0) {
              testing::Message::Message((Message *)local_130);
              if (local_c8 == (EVP_MD *)0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)local_c8;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_158,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                         ,0x40,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_158,(Message *)local_130);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
              if (local_130 != (undefined1  [8])0x0) {
                (**(code **)(*(size_type *)local_130 + 8))();
              }
            }
            if (local_c8 != (EVP_MD *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8);
            }
            HMAC_CTX_init((HMAC_CTX *)local_d0);
            iVar2 = HMAC_Init_ex((HMAC_CTX *)local_d0,
                                 local_e8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (int)local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                 (int)local_e8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,pEVar3,(ENGINE *)0x0
                                );
            local_158[0] = iVar2 != 0;
            local_150 = (EVP_MD *)0x0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_148);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_130,(internal *)local_158,
                         (AssertionResult *)
                         "HMAC_Init_ex(ctx.get(), key.data(), key.size(), digest, nullptr)","false",
                         "true",(char *)expected_predicate_value._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_138,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                         ,0x45,(char *)local_130);
              testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
LAB_00310ed2:
              pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_150;
              testing::internal::AssertHelper::~AssertHelper(&local_138);
              if (local_130 != (undefined1  [8])&local_120) {
                operator_delete((void *)local_130,local_120._M_allocated_capacity + 1);
              }
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_148.span_.data_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_148.span_.data_ + 8))();
              }
              pEVar3 = local_150;
              if (local_150 != (EVP_MD *)0x0) {
LAB_00310f14:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(pdVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pEVar3);
              }
            }
            else {
              iVar2 = HMAC_Update((HMAC_CTX *)local_d0,
                                  local_108.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_108.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Update(ctx.get(), input.data(), input.size())",
                           "false","true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x46,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              iVar2 = HMAC_Final((HMAC_CTX *)local_d0,
                                 (uchar *)md._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,&local_10c);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Final(ctx.get(), mac.get(), &mac_len)","false",
                           "true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x47,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              local_150 = (EVP_MD *)
                          ((long)local_68.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              local_158 = (undefined1  [8])
                          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_148.span_.size_ = (size_t)local_10c;
              local_148.span_.data_ =
                   (uchar *)md._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_130,"Bytes(output)","Bytes(mac.get(), mac_len)",
                         (Bytes *)local_158,&local_148);
              if (local_130[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_158);
                if (local_128 == (EVP_MD *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)local_128;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_148,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x48,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_148,(Message *)local_158);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
                if (local_158 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_158 + 8))();
                }
              }
              if (local_128 != (EVP_MD *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              }
              iVar2 = HMAC_Init_ex((HMAC_CTX *)local_d0,(void *)0x0,0,pEVar3,(ENGINE *)0x0);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Init_ex(ctx.get(), nullptr, 0, digest, nullptr)"
                           ,"false","true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x4b,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              iVar2 = HMAC_Update((HMAC_CTX *)local_d0,
                                  local_108.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_108.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Update(ctx.get(), input.data(), input.size())",
                           "false","true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x4c,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              iVar2 = HMAC_Final((HMAC_CTX *)local_d0,
                                 (uchar *)md._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,&local_10c);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Final(ctx.get(), mac.get(), &mac_len)","false",
                           "true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x4d,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              local_150 = (EVP_MD *)
                          ((long)local_68.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              local_158 = (undefined1  [8])
                          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_148.span_.size_ = (size_t)local_10c;
              local_148.span_.data_ =
                   (uchar *)md._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_130,"Bytes(output)","Bytes(mac.get(), mac_len)",
                         (Bytes *)local_158,&local_148);
              if (local_130[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_158);
                if (local_128 == (EVP_MD *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)local_128;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_148,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x4e,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_148,(Message *)local_158);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
                if (local_158 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_158 + 8))();
                }
              }
              if (local_128 != (EVP_MD *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_128,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              }
              iVar2 = HMAC_Init_ex((HMAC_CTX *)local_d0,(void *)0x0,0,(EVP_MD *)0x0,(ENGINE *)0x0);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)
                           "HMAC_Init_ex(ctx.get(), nullptr, 0, nullptr, nullptr)","false","true",
                           (char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x51,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                uVar7 = 0;
                do {
                  local_150 = (EVP_MD *)0x0;
                  iVar2 = HMAC_Update((HMAC_CTX *)local_d0,
                                      local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar7,1);
                  local_158[0] = iVar2 != 0;
                  local_150 = (EVP_MD *)0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_148);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_130,(internal *)local_158,
                               (AssertionResult *)"HMAC_Update(ctx.get(), &input[i], 1)","false",
                               "true",(char *)expected_predicate_value._M_head_impl);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_138,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                               ,0x53,(char *)local_130);
                    testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                    goto LAB_00310ed2;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < (ulong)((long)local_108.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_108.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start));
              }
              local_150 = (EVP_MD *)0x0;
              iVar2 = HMAC_Final((HMAC_CTX *)local_d0,
                                 (uchar *)md._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl,&local_10c);
              local_158[0] = iVar2 != 0;
              local_150 = (EVP_MD *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_148);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_130,(internal *)local_158,
                           (AssertionResult *)"HMAC_Final(ctx.get(), mac.get(), &mac_len)","false",
                           "true",(char *)expected_predicate_value._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x55,(char *)local_130);
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_148);
                goto LAB_00310ed2;
              }
              local_150 = (EVP_MD *)
                          (local_68.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish +
                          -(long)local_68.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              local_158 = (undefined1  [8])
                          local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_148.span_.size_ = (size_t)local_10c;
              local_148.span_.data_ =
                   (uchar *)md._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_130,"Bytes(output)","Bytes(mac.get(), mac_len)",
                         (Bytes *)local_158,&local_148);
              if (local_130[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_158);
                if (local_128 == (EVP_MD *)0x0) {
                  pcVar6 = "";
                }
                else {
                  pcVar6 = *(char **)local_128;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_148,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
                           ,0x56,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_148,(Message *)local_158);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
                if (local_158 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_158 + 8))();
                }
              }
              if (local_128 != (EVP_MD *)0x0) {
                pdVar5 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_128;
                pEVar3 = local_128;
                goto LAB_00310f14;
              }
            }
            HMAC_CTX_cleanup((HMAC_CTX *)local_d0);
          }
          operator_delete__((void *)md._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
        }
      }
LAB_0031047f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((long *)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_003104d0;
    }
    testing::Message::Message((Message *)&local_e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x10),"Unknown digest: ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x10),local_48._M_dataplus._M_p,
               local_48._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)local_130,(AssertionResult *)0x54b2fe,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hmac/hmac_test.cc"
               ,0x33,(char *)local_d0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if (local_d0 != (undefined1  [8])local_c0) {
      operator_delete((void *)local_d0,local_c0[0]._M_allocated_capacity + 1);
    }
    if ((long *)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_128 != (EVP_MD *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  }
LAB_003104d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST(HMACTest, TestVectors) {
  FileTestGTest("crypto/hmac/hmac_tests.txt", [](FileTest *t) {
    std::string digest_str;
    ASSERT_TRUE(t->GetAttribute(&digest_str, "HMAC"));
    const EVP_MD *digest = GetDigest(digest_str);
    ASSERT_TRUE(digest) << "Unknown digest: " << digest_str;

    std::vector<uint8_t> key, input, output;
    ASSERT_TRUE(t->GetBytes(&key, "Key"));
    ASSERT_TRUE(t->GetBytes(&input, "Input"));
    ASSERT_TRUE(t->GetBytes(&output, "Output"));
    ASSERT_EQ(EVP_MD_size(digest), output.size());

    // Test using the one-shot API.
    auto mac = std::make_unique<uint8_t[]>(EVP_MD_size(digest));
    unsigned mac_len;
    ASSERT_TRUE(HMAC(digest, key.data(), key.size(), input.data(), input.size(),
                     mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test using HMAC_CTX.
    bssl::ScopedHMAC_CTX ctx;
    ASSERT_TRUE(
        HMAC_Init_ex(ctx.get(), key.data(), key.size(), digest, nullptr));
    ASSERT_TRUE(HMAC_Update(ctx.get(), input.data(), input.size()));
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test that an HMAC_CTX may be reset with the same key.
    ASSERT_TRUE(HMAC_Init_ex(ctx.get(), nullptr, 0, digest, nullptr));
    ASSERT_TRUE(HMAC_Update(ctx.get(), input.data(), input.size()));
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));

    // Test feeding the input in byte by byte.
    ASSERT_TRUE(HMAC_Init_ex(ctx.get(), nullptr, 0, nullptr, nullptr));
    for (size_t i = 0; i < input.size(); i++) {
      ASSERT_TRUE(HMAC_Update(ctx.get(), &input[i], 1));
    }
    ASSERT_TRUE(HMAC_Final(ctx.get(), mac.get(), &mac_len));
    EXPECT_EQ(Bytes(output), Bytes(mac.get(), mac_len));
  });
}